

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr.c
# Opt level: O2

void mllr_dump(float32 ***A,float32 **B,float32 **H,int32 veclen,int32 nclass)

{
  uint __line;
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (A == (float32 ***)0x0) {
    pcVar1 = "A != NULL";
    __line = 0x52;
  }
  else {
    if (B != (float32 **)0x0) {
      pcVar1 = (char *)__ckd_calloc__((long)((veclen + 2) * veclen * 0x14),1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                                      ,0x55);
      uVar2 = 0;
      if (0 < veclen) {
        uVar2 = (ulong)(uint)veclen;
      }
      if (nclass < 1) {
        nclass = 0;
      }
      for (uVar4 = 0; uVar4 != (uint)nclass; uVar4 = uVar4 + 1) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                ,0x58,"%d:\n",uVar4 & 0xffffffff);
        for (uVar5 = 0; uVar5 != uVar2; uVar5 = uVar5 + 1) {
          sprintf(pcVar1,"A %d ",uVar5 & 0xffffffff);
          for (uVar3 = 0; (uint)veclen != uVar3; uVar3 = uVar3 + 1) {
            sprintf(pcVar1,"%s %f ",(double)(float)A[uVar4][uVar5][uVar3],pcVar1);
          }
          sprintf(pcVar1,"%s\n",pcVar1);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                  ,0x5f,"%s\n",pcVar1);
        }
        pcVar1[2] = '\0';
        pcVar1[0] = 'B';
        pcVar1[1] = '\n';
        for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
          sprintf(pcVar1,"%s %f ",(double)(float)B[uVar4][uVar5],pcVar1);
        }
        sprintf(pcVar1,"%s \n",pcVar1);
        pcVar1[0] = 'H';
        pcVar1[1] = '\n';
        pcVar1[2] = '\0';
        for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
          sprintf(pcVar1,"%s %f ",(double)(float)H[uVar4][uVar5],pcVar1);
        }
        sprintf(pcVar1,"%s \n",pcVar1);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                ,0x6e,"%s\n",pcVar1);
      }
      ckd_free(pcVar1);
      return;
    }
    pcVar1 = "B != NULL";
    __line = 0x53;
  }
  __assert_fail(pcVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                ,__line,"void mllr_dump(float32 ***, float32 **, float32 **, int32, int32)");
}

Assistant:

void
mllr_dump(float32 *** A, float32 ** B, float32 **H, 
	  int32 veclen, int32 nclass)
{
    int32 i, j, k;
    char *tmpstr;
    assert(A != NULL);
    assert(B != NULL);

    tmpstr = ckd_calloc((veclen * (veclen + 2) * 20), sizeof(char));

    for (i = 0; i < nclass; i++) {
        E_INFO("%d:\n", i);
        for (j = 0; j < veclen; j++) {
            sprintf(tmpstr, "A %d ", j);
            for (k = 0; k < veclen; k++) {
                sprintf(tmpstr, "%s %f ", tmpstr, A[i][j][k]);
            }
            sprintf(tmpstr, "%s\n", tmpstr);
            E_INFO("%s\n", tmpstr);
        }

        sprintf(tmpstr, "B\n");
        for (j = 0; j < veclen; j++) {
            sprintf(tmpstr, "%s %f ", tmpstr, B[i][j]);
        }
        sprintf(tmpstr, "%s \n", tmpstr);

        sprintf(tmpstr, "H\n");
        for (j = 0; j < veclen; j++) {
            sprintf(tmpstr, "%s %f ", tmpstr, H[i][j]);
        }
        sprintf(tmpstr, "%s \n", tmpstr);

        E_INFO("%s\n", tmpstr);
    }

    ckd_free(tmpstr);
}